

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
begin_array(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
           item_event_visitor *visitor,uint8_t info,error_code *ec)

{
  semantic_tag tag_00;
  bool bVar1;
  int iVar2;
  parse_mode *__args;
  int iVar3;
  error_code *in_RCX;
  char in_DL;
  bitset<3UL> *in_RDI;
  size_t len;
  bool pop_stringref_map_stack;
  semantic_tag tag;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffffa4;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar5;
  reference local_48;
  reference local_38;
  undefined1 local_22;
  undefined1 local_21;
  error_code *local_20;
  char local_11;
  
  iVar3 = (int)in_RDI[3].super__Base_bitset<1UL>._M_w + 1;
  *(int *)&in_RDI[3].super__Base_bitset<1UL>._M_w = iVar3;
  local_20 = in_RCX;
  local_11 = in_DL;
  iVar2 = cbor_options_common::max_nesting_depth
                    ((cbor_options_common *)
                     ((long)&in_RDI[0x39].super__Base_bitset<1UL>._M_w +
                     *(long *)(in_RDI[0x39].super__Base_bitset<1UL>._M_w - 0x18)));
  if (iVar2 < iVar3) {
    std::error_code::operator=
              ((error_code *)CONCAT44(in_stack_ffffffffffffffa4,iVar3),
               (cbor_errc)((ulong)in_RDI >> 0x20));
    *(undefined1 *)&in_RDI[1].super__Base_bitset<1UL>._M_w = 0;
  }
  else {
    local_21 = 0;
    local_22 = 0;
    std::bitset<3UL>::operator[]
              (in_RDI,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    tag_00 = std::bitset::reference::operator_cast_to_bool
                       ((reference *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    std::bitset<3UL>::reference::~reference(&local_38);
    if ((tag_00 & noesc) != none) {
      std::
      vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
      ::emplace_back<>((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                        *)CONCAT17(tag_00,in_stack_ffffffffffffff90));
      std::bitset<3UL>::operator[](in_RDI,CONCAT17(tag_00,in_stack_ffffffffffffff90));
      std::bitset<3UL>::reference::operator=
                ((reference *)CONCAT17(tag_00,in_stack_ffffffffffffff90),
                 (bool)in_stack_ffffffffffffff8f);
      std::bitset<3UL>::reference::~reference(&local_48);
      local_22 = 1;
    }
    if (local_11 == '\x1f') {
      uVar5 = 3;
      uVar4 = 0;
      std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
      emplace_back<jsoncons::cbor::parse_mode,int,bool&>
                ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                  *)0x300000000,(parse_mode *)in_stack_ffffffffffffffa8,
                 (int *)CONCAT44(in_stack_ffffffffffffffa4,iVar3),(bool *)in_RDI);
      basic_item_event_visitor<char>::begin_array
                ((basic_item_event_visitor<char> *)CONCAT44(in_stack_ffffffffffffffa4,iVar3),
                 (semantic_tag)((ulong)in_RDI >> 0x38),
                 (ser_context *)CONCAT17(tag_00,in_stack_ffffffffffffff90),
                 (error_code *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      *(byte *)&in_RDI[1].super__Base_bitset<1UL>._M_w =
           (*(byte *)((long)&in_RDI[1].super__Base_bitset<1UL>._M_w + 2) ^ 0xff) & 1;
      stream_source<unsigned_char>::ignore
                ((stream_source<unsigned_char> *)CONCAT44(uVar5,uVar4),
                 (size_t)in_stack_ffffffffffffffa8);
    }
    else {
      __args = (parse_mode *)
               get_size(in_stack_ffffffffffffffa8,
                        (error_code *)CONCAT44(in_stack_ffffffffffffffa4,iVar3));
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (!bVar1) {
        uVar4 = 2;
        std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
        emplace_back<jsoncons::cbor::parse_mode,unsigned_long&,bool&>
                  ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                    *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),__args,
                   (unsigned_long *)CONCAT44(2,iVar3),(bool *)in_RDI);
        basic_item_event_visitor<char>::begin_array
                  ((basic_item_event_visitor<char> *)CONCAT44(uVar4,iVar3),(size_t)in_RDI,tag_00,
                   (ser_context *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                   (error_code *)0x2e671d);
        *(byte *)&in_RDI[1].super__Base_bitset<1UL>._M_w =
             (*(byte *)((long)&in_RDI[1].super__Base_bitset<1UL>._M_w + 2) ^ 0xff) & 1;
      }
    }
  }
  return;
}

Assistant:

void begin_array(item_event_visitor& visitor, uint8_t info, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = cbor_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 
        semantic_tag tag = semantic_tag::none;
        bool pop_stringref_map_stack = false;
        if (other_tags_[stringref_namespace_tag])
        {
            stringref_map_stack_.emplace_back();
            other_tags_[stringref_namespace_tag] = false;
            pop_stringref_map_stack = true;
        }
        switch (info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                state_stack_.emplace_back(parse_mode::indefinite_array,0,pop_stringref_map_stack);
                visitor.begin_array(tag, *this, ec);
                more_ = !cursor_mode_;
                source_.ignore(1);
                break;
            }
            default: // definite length
            {
                std::size_t len = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                state_stack_.emplace_back(parse_mode::array,len,pop_stringref_map_stack);
                visitor.begin_array(len, tag, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
        }
    }